

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

put_transaction<int_Struct::*> * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
::
start_emplace<int_density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct::*>
          (put_transaction<int_Struct::*> *__return_storage_ptr__,
          lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
          *this,offset_in_Struct_to_int *i_construction_params)

{
  Allocation push_data;
  Allocation local_60;
  put_transaction<int_Struct::*> local_48;
  
  detail::
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,8ul,8ul>
            (&local_60,this);
  local_60.m_control_block[1].m_next =
       (uintptr_t)
       detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>::
       Impl<int_Struct::*>::align_invoke_destroy;
  local_60.m_control_block[2].m_next =
       (uintptr_t)
       detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>::
       Impl<int_Struct::*>::align_destroy;
  *(offset_in_Struct_to_int *)local_60.m_user_storage = *i_construction_params;
  local_48.m_put.m_control_block = local_60.m_control_block;
  local_48.m_put.m_next_ptr = local_60.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_60.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_60.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_60.m_next_ptr;
  __return_storage_ptr__->m_queue =
       (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
        *)this;
  local_48.m_put.m_user_storage = (void *)0x0;
  local_48.m_queue =
       (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
        *)this;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::put_transaction<int_Struct::*>::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();

                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }